

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_socket_bind(ENetSocket socket,ENetAddress *address)

{
  undefined8 uVar1;
  int iVar2;
  sockaddr local_1c;
  undefined4 uStack_c;
  undefined4 local_8;
  undefined4 uStack_4;
  
  local_1c.sa_data[2] = '\0';
  local_1c.sa_data[3] = '\0';
  local_1c.sa_data[4] = '\0';
  local_1c.sa_data[5] = '\0';
  uStack_4 = 0;
  local_1c.sa_family = 10;
  if (address == (ENetAddress *)0x0) {
    local_1c.sa_data._6_4_ = SUB84(_in6addr_any,0);
    local_1c.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
    uStack_c = (undefined4)_setsockopt;
    local_8 = (undefined4)((ulong)_setsockopt >> 0x20);
    local_1c.sa_data._0_2_ = 0;
  }
  else {
    local_1c.sa_data._0_2_ = address->port << 8 | address->port >> 8;
    uVar1 = *(undefined8 *)((long)&address->field_0 + 8);
    local_1c.sa_data._6_4_ = SUB84(*(undefined8 *)&address->field_0,0);
    local_1c.sa_data._10_4_ = SUB84((ulong)*(undefined8 *)&address->field_0 >> 0x20,0);
    uStack_c = (undefined4)uVar1;
    local_8 = (undefined4)((ulong)uVar1 >> 0x20);
  }
  iVar2 = bind(socket,&local_1c,0x1c);
  return iVar2;
}

Assistant:

int enet_socket_bind(ENetSocket socket, const ENetAddress* address) {
	struct sockaddr_in6 sin;

	memset(&sin, 0, sizeof(struct sockaddr_in6));

	sin.sin6_family = AF_INET6;

	if (address != NULL) {
		sin.sin6_port = ENET_HOST_TO_NET_16(address->port);
		sin.sin6_addr = address->ipv6;
	}
	else {
		sin.sin6_port = 0;
		sin.sin6_addr = ENET_HOST_ANY;
	}

	return bind(socket, (struct sockaddr*)&sin, sizeof(struct sockaddr_in6));
}